

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

DWORD __thiscall Memory::HeapInfo::IdleDecommit(HeapInfo *this)

{
  DWORD local_14;
  HeapInfo *pHStack_10;
  DWORD waitTime;
  HeapInfo *this_local;
  
  local_14 = 0xffffffff;
  pHStack_10 = this;
  ForEachPageAllocator<Memory::HeapInfo::IdleDecommit()::__0>
            (this,(anon_class_8_1_f68bbb60)&local_14);
  return local_14;
}

Assistant:

DWORD HeapInfo::IdleDecommit()
{
    DWORD waitTime = INFINITE;
    ForEachPageAllocator([&](IdleDecommitPageAllocator * pageAlloc)
    {
        DWORD pageAllocatorWaitTime = pageAlloc->IdleDecommit();
        waitTime = min(waitTime, pageAllocatorWaitTime);
    });
    return waitTime;
}